

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Printer::PrintAny
          (Printer *this,Message *message,TextGenerator *generator)

{
  string *__return_storage_ptr__;
  Finder *pFVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Descriptor *type;
  Message *pMVar4;
  undefined4 extraout_var_00;
  FastFieldValuePrinter *pFVar5;
  LogMessage *pLVar6;
  Reflection *this_00;
  LogMessage local_150;
  undefined1 local_118 [8];
  DynamicMessageFactory factory;
  string serialized_value;
  string url_prefix;
  string full_type_name;
  undefined8 local_68;
  FieldDescriptor *local_50;
  FieldDescriptor *type_url_field;
  FieldDescriptor *value_field;
  LogFinisher local_31;
  
  bVar2 = internal::GetAnyFieldDescriptors(message,&local_50,&type_url_field);
  if (!bVar2) {
    return false;
  }
  (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  __return_storage_ptr__ = (string *)((long)&full_type_name.field_2 + 8);
  Reflection::GetString_abi_cxx11_(__return_storage_ptr__,this_00,message,local_50);
  serialized_value.field_2._8_8_ = &url_prefix._M_string_length;
  url_prefix._M_dataplus._M_p = (pointer)0x0;
  url_prefix._M_string_length._0_1_ = 0;
  url_prefix.field_2._8_8_ = &full_type_name._M_string_length;
  full_type_name._M_dataplus._M_p = (pointer)0x0;
  full_type_name._M_string_length._0_1_ = 0;
  bVar2 = internal::ParseAnyTypeUrl
                    (__return_storage_ptr__,(string *)((long)&serialized_value.field_2 + 8),
                     (string *)((long)&url_prefix.field_2 + 8));
  if (bVar2) {
    pFVar1 = this->finder_;
    if (pFVar1 == (Finder *)0x0) {
      type = anon_unknown_20::DefaultFinderFindAnyType
                       (message,(string *)((long)&serialized_value.field_2 + 8),
                        (string *)((long)&url_prefix.field_2 + 8));
    }
    else {
      iVar3 = (*pFVar1->_vptr_Finder[4])
                        (pFVar1,message,(undefined1 *)((long)&serialized_value.field_2 + 8),
                         (undefined1 *)((long)&url_prefix.field_2 + 8));
      type = (Descriptor *)CONCAT44(extraout_var,iVar3);
    }
    if (type != (Descriptor *)0x0) {
      DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)local_118);
      pMVar4 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)local_118,type);
      iVar3 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[3])(pMVar4);
      value_field = (FieldDescriptor *)CONCAT44(extraout_var_00,iVar3);
      Reflection::GetString_abi_cxx11_
                ((string *)
                 &factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__next,
                 this_00,message,type_url_field);
      bVar2 = MessageLite::ParseFromString
                        ((MessageLite *)CONCAT44(extraout_var_00,iVar3),
                         (string *)
                         &factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.
                          __next);
      if (bVar2) {
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,"[",1);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,full_type_name.field_2._8_8_,local_68);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,"]",1);
        pFVar5 = GetFieldPrinter(this,type_url_field);
        (*pFVar5->_vptr_FastFieldValuePrinter[0xe])
                  (pFVar5,message,0xffffffffffffffff,0,(ulong)this->single_line_mode_,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        Print(this,(Message *)value_field,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])(generator);
        (*pFVar5->_vptr_FastFieldValuePrinter[0x10])
                  (pFVar5,message,0xffffffffffffffff,0,(ulong)this->single_line_mode_,generator);
      }
      else {
        internal::LogMessage::LogMessage
                  (&local_150,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/text_format.cc"
                   ,0x7aa);
        pLVar6 = internal::LogMessage::operator<<
                           (&local_150,(string *)((long)&full_type_name.field_2 + 8));
        pLVar6 = internal::LogMessage::operator<<(pLVar6,": failed to parse contents");
        internal::LogFinisher::operator=(&local_31,pLVar6);
        internal::LogMessage::~LogMessage(&local_150);
      }
      std::__cxx11::string::~string
                ((string *)
                 &factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__next);
      (**(code **)(*(long *)value_field + 8))();
      DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)local_118);
      goto LAB_00312772;
    }
    internal::LogMessage::LogMessage
              ((LogMessage *)local_118,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/text_format.cc"
               ,0x7a1);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)local_118,"Can\'t print proto content: proto type ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,(string *)((long)&full_type_name.field_2 + 8));
    pLVar6 = internal::LogMessage::operator<<(pLVar6," not found");
    internal::LogFinisher::operator=((LogFinisher *)&local_150,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)local_118);
  }
  bVar2 = false;
LAB_00312772:
  std::__cxx11::string::~string((string *)(url_prefix.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(serialized_value.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(full_type_name.field_2._M_local_buf + 8));
  return bVar2;
}

Assistant:

bool TextFormat::Printer::PrintAny(const Message& message,
                                   TextGenerator* generator) const {
  const FieldDescriptor* type_url_field;
  const FieldDescriptor* value_field;
  if (!internal::GetAnyFieldDescriptors(message, &type_url_field,
                                        &value_field)) {
    return false;
  }

  const Reflection* reflection = message.GetReflection();

  // Extract the full type name from the type_url field.
  const std::string& type_url = reflection->GetString(message, type_url_field);
  std::string url_prefix;
  std::string full_type_name;
  if (!internal::ParseAnyTypeUrl(type_url, &url_prefix, &full_type_name)) {
    return false;
  }

  // Print the "value" in text.
  const Descriptor* value_descriptor =
      finder_ ? finder_->FindAnyType(message, url_prefix, full_type_name)
              : DefaultFinderFindAnyType(message, url_prefix, full_type_name);
  if (value_descriptor == nullptr) {
    GOOGLE_LOG(WARNING) << "Can't print proto content: proto type " << type_url
                 << " not found";
    return false;
  }
  DynamicMessageFactory factory;
  std::unique_ptr<Message> value_message(
      factory.GetPrototype(value_descriptor)->New());
  std::string serialized_value = reflection->GetString(message, value_field);
  if (!value_message->ParseFromString(serialized_value)) {
    GOOGLE_LOG(WARNING) << type_url << ": failed to parse contents";
    return false;
  }
  generator->PrintLiteral("[");
  generator->PrintString(type_url);
  generator->PrintLiteral("]");
  const FastFieldValuePrinter* printer = GetFieldPrinter(value_field);
  printer->PrintMessageStart(message, -1, 0, single_line_mode_, generator);
  generator->Indent();
  Print(*value_message, generator);
  generator->Outdent();
  printer->PrintMessageEnd(message, -1, 0, single_line_mode_, generator);
  return true;
}